

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  uint uVar1;
  float *pfVar2;
  unsigned_short *puVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImWchar IVar9;
  ImFontGlyph *pIVar10;
  ImFontGlyph *pIVar11;
  ImFontGlyph *pIVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  float fVar19;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  
  uVar14 = 0;
  for (lVar13 = 0; (ulong)(uint)(this->Glyphs).Size * 0x28 - lVar13 != 0; lVar13 = lVar13 + 0x28) {
    uVar15 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar13) >> 2;
    if (uVar14 <= uVar15) {
      uVar14 = uVar15;
    }
  }
  ImVector<float>::clear(&this->IndexAdvanceX);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar14 + 1);
  uVar15 = (this->Glyphs).Size;
  lVar13 = (long)(int)uVar15;
  pIVar12 = (this->Glyphs).Data;
  pfVar2 = (this->IndexAdvanceX).Data;
  puVar3 = (this->IndexLookup).Data;
  uVar16 = 0;
  uVar17 = 0;
  if (0 < (int)uVar15) {
    uVar17 = (ulong)uVar15;
  }
  pfVar18 = &pIVar12->AdvanceX;
  for (; uVar17 != uVar16; uVar16 = uVar16 + 1) {
    uVar1 = *(uint *)(pfVar18 + -1);
    *(float *)((long)pfVar2 + (ulong)(uVar1 & 0xfffffffc)) = *pfVar18;
    puVar3[uVar1 >> 2] = (unsigned_short)uVar16;
    this->Used4kPagesMap[uVar1 >> 0x11] =
         this->Used4kPagesMap[uVar1 >> 0x11] | (byte)(1 << ((byte)(uVar1 >> 0xe) & 7));
    pfVar18 = pfVar18 + 10;
  }
  pIVar10 = FindGlyph(this,0x20);
  if (pIVar10 != (ImFontGlyph *)0x0) {
    if (((undefined1  [40])pIVar12[lVar13 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      ImVector<ImFontGlyph>::resize(&this->Glyphs,uVar15 + 1);
      pIVar12 = (this->Glyphs).Data;
      lVar13 = (long)(this->Glyphs).Size;
    }
    pIVar11 = FindGlyph(this,0x20);
    fVar19 = pIVar11->AdvanceX;
    fVar5 = pIVar11->X0;
    fVar6 = pIVar11->Y0;
    fVar7 = pIVar11->X1;
    fVar8 = pIVar11->Y1;
    uVar4 = *(undefined8 *)&pIVar11->U0;
    pIVar10 = pIVar12 + lVar13 + -1;
    *(undefined4 *)&pIVar10->field_0x0 = *(undefined4 *)&pIVar11->field_0x0;
    pIVar10->AdvanceX = fVar19;
    pIVar10->X0 = fVar5;
    pIVar10->Y0 = fVar6;
    pIVar10 = pIVar12 + lVar13 + -1;
    pIVar10->X1 = fVar7;
    pIVar10->Y1 = fVar8;
    *(undefined8 *)(&pIVar10->X1 + 2) = uVar4;
    fVar19 = pIVar11->V1;
    pIVar12[lVar13 + -1].U1 = pIVar11->U1;
    pIVar12[lVar13 + -1].V1 = fVar19;
    *(uint *)(pIVar12 + lVar13 + -1) = *(uint *)(pIVar12 + lVar13 + -1) & 3 | 0x24;
    fVar19 = pIVar12[lVar13 + -1].AdvanceX * 4.0;
    pIVar12[lVar13 + -1].AdvanceX = fVar19;
    (this->IndexAdvanceX).Data[9] = fVar19;
    (this->IndexLookup).Data[*(uint *)(pIVar12 + lVar13 + -1) >> 2] = (short)(this->Glyphs).Size - 1
    ;
  }
  SetGlyphVisible(this,0x20,false);
  SetGlyphVisible(this,9,false);
  ellipsis_chars[0] = 0x2026;
  ellipsis_chars[1] = 0x85;
  dots_chars[0] = 0x2e;
  dots_chars[1] = 0xff0e;
  if (this->EllipsisChar == 0xffff) {
    IVar9 = FindFirstExistingGlyph(this,ellipsis_chars,2);
    this->EllipsisChar = IVar9;
  }
  if (this->DotChar == 0xffff) {
    IVar9 = FindFirstExistingGlyph(this,dots_chars,2);
    this->DotChar = IVar9;
  }
  pIVar12 = FindGlyphNoFallback(this,this->FallbackChar);
  this->FallbackGlyph = pIVar12;
  if (pIVar12 == (ImFontGlyph *)0x0) {
    IVar9 = FindFirstExistingGlyph(this,(ImWchar *)&DAT_00157682,3);
    this->FallbackChar = IVar9;
    pIVar12 = FindGlyphNoFallback(this,IVar9);
    this->FallbackGlyph = pIVar12;
    if (pIVar12 == (ImFontGlyph *)0x0) {
      pIVar12 = (this->Glyphs).Data + (long)(this->Glyphs).Size + -1;
      this->FallbackGlyph = pIVar12;
      this->FallbackChar = (ImWchar)(*(uint *)pIVar12 >> 2);
    }
  }
  fVar19 = pIVar12->AdvanceX;
  this->FallbackAdvanceX = fVar19;
  pfVar2 = (this->IndexAdvanceX).Data;
  for (uVar16 = 0; uVar14 + 1 != uVar16; uVar16 = uVar16 + 1) {
    pfVar18 = pfVar2 + uVar16;
    if (*pfVar18 <= 0.0 && *pfVar18 != 0.0) {
      pfVar2[uVar16] = fVar19;
    }
  }
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}